

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
  *__r;
  shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
  *this_00;
  int *in_RDI;
  _func_double_uchar_ptr_int_int_int_int **unaff_retaddr;
  _func_double_uchar_ptr_int_int_int_int **in_stack_00000008;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_stack_00000020;
  int *in_stack_fffffffffffffff0;
  
  bVar1 = AtEnd(in_stack_00000020);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x6529be);
    __r = (shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
           *)ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator*
                       ((ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
                        0x6529c6);
    std::
    get<1ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x6529d8);
    this_00 = (shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
               *)ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator*
                           ((ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
                            0x6529e0);
    std::
    get<2ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x6529f3);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x6529fb);
    std::
    get<3ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x652a0e);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x652a16);
    std::
    make_shared<std::tuple<double(*)(unsigned_char_const*,int,int,int,int),double(*)(unsigned_char_const*,int,int,int,int),int,int>,double(*const&)(unsigned_char_const*,int,int,int,int),double(*const&)(unsigned_char_const*,int,int,int,int),int_const&,int_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    std::
    shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
    ::operator=(this_00,__r);
    std::
    shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
    ::~shared_ptr((shared_ptr<std::tuple<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>_>
                   *)0x652a4e);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }